

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

iteration_time __thiscall helics::Federate::requestTimeIterativeComplete(Federate *this)

{
  undefined1 auVar1 [12];
  bool bVar2;
  InvalidFunctionCall *this_00;
  string_view message;
  iteration_time iVar3;
  Modes exp;
  handle asyncInfo;
  
  exp = PENDING_ITERATIVE_TIME;
  bVar2 = std::atomic<helics::Federate::Modes>::compare_exchange_strong
                    (&this->currentMode,&exp,EXECUTING,seq_cst);
  if (!bVar2) {
    this_00 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
    message._M_str =
         "cannot call requestTimeIterativeComplete without first calling requestTimeIterativeAsync function"
    ;
    message._M_len = 0x61;
    InvalidFunctionCall::InvalidFunctionCall(this_00,message);
    __cxa_throw(this_00,&InvalidFunctionCall::typeinfo,HelicsException::~HelicsException);
  }
  gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>::lock
            (&asyncInfo,
             (this->asyncCallInfo)._M_t.
             super___uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
             .
             super__Head_base<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_false>
             ._M_head_impl);
  iVar3 = std::future<helics::iteration_time>::get(&(asyncInfo.data)->timeRequestIterativeFuture);
  switch(iVar3._8_4_ & 0xff) {
  case 0:
    bVar2 = false;
    goto LAB_001f7b91;
  case 2:
    bVar2 = true;
LAB_001f7b91:
    postTimeRequestOperations(this,iVar3.grantedTime.internalTimeCode,bVar2);
    break;
  case 3:
    updateFederateMode(this,FINISHED);
    updateSimulationTime
              (this,iVar3.grantedTime.internalTimeCode,(Time)(this->mCurrentTime).internalTimeCode,
               false);
    break;
  case 7:
    updateFederateMode(this,ERROR_STATE);
  }
  std::unique_lock<std::mutex>::~unique_lock(&asyncInfo.m_handle_lock);
  auVar1 = iVar3._0_12_;
  iVar3._12_4_ = 0;
  iVar3.grantedTime.internalTimeCode = auVar1._0_8_;
  iVar3.state = auVar1[8];
  iVar3._9_3_ = auVar1._9_3_;
  return iVar3;
}

Assistant:

iteration_time Federate::requestTimeIterativeComplete()
{
    auto exp = Modes::PENDING_ITERATIVE_TIME;
    if (currentMode.compare_exchange_strong(exp, Modes::EXECUTING)) {
        auto asyncInfo = asyncCallInfo->lock();
        auto iterativeTime = asyncInfo->timeRequestIterativeFuture.get();
        switch (iterativeTime.state) {
            case IterationResult::NEXT_STEP:
                postTimeRequestOperations(iterativeTime.grantedTime, false);
                break;
            case IterationResult::ITERATING:
                postTimeRequestOperations(iterativeTime.grantedTime, true);
                break;
            case IterationResult::HALTED:
                updateFederateMode(Modes::FINISHED);
                updateSimulationTime(iterativeTime.grantedTime, mCurrentTime, false);
                break;
            case IterationResult::ERROR_RESULT:
                // LCOV_EXCL_START
                updateFederateMode(Modes::ERROR_STATE);
                break;
                // LCOV_EXCL_STOP
        }
        return iterativeTime;
    }
    throw(InvalidFunctionCall(
        "cannot call requestTimeIterativeComplete without first calling requestTimeIterativeAsync function"));
}